

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

CallInfo * luaD_precall(lua_State *L,StkId func,int nresults)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  uint n;
  CallInfo *pCVar4;
  ptrdiff_t t___1;
  ptrdiff_t t__;
  int fsize;
  int nfixparams;
  int narg;
  Proto *p;
  CallInfo *ci;
  uint status;
  int nresults_local;
  StkId func_local;
  lua_State *L_local;
  
  ci._0_4_ = nresults + 1;
  _status = func;
  while( true ) {
    bVar3 = (_status->val).tt_ & 0x3f;
    if (bVar3 == 6) {
      lVar2 = *(long *)((_status->val).value_.f + 0x18);
      fsize = (int)((long)(L->top).p - (long)_status >> 4) + -1;
      bVar3 = *(byte *)(lVar2 + 10);
      n = (uint)*(byte *)(lVar2 + 0xc);
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)(int)n) {
        lVar1 = (L->stack).offset;
        luaD_growstack(L,n,1);
        _status = (StkId)((long)(L->stack).p + ((long)_status - lVar1));
      }
      pCVar4 = prepCallInfo(L,_status,(uint)ci,_status + (long)(int)n + 1);
      L->ci = pCVar4;
      (pCVar4->u).l.savedpc = *(Instruction **)(lVar2 + 0x40);
      for (; fsize < (int)(uint)bVar3; fsize = fsize + 1) {
        lVar2 = (L->top).offset;
        (L->top).p = (StkId)(lVar2 + 0x10);
        *(undefined1 *)(lVar2 + 8) = 0;
      }
      return pCVar4;
    }
    if (bVar3 == 0x16) break;
    if (bVar3 == 0x26) {
      precallC(L,_status,(uint)ci,*(lua_CFunction *)((_status->val).value_.f + 0x18));
      return (CallInfo *)0x0;
    }
    if ((long)(L->stack_last).p - (L->top).offset >> 4 < 2) {
      lVar2 = (L->stack).offset;
      luaD_growstack(L,1,1);
      _status = (StkId)((long)(L->stack).p + ((long)_status - lVar2));
    }
    ci._0_4_ = tryfuncTM(L,_status,(uint)ci);
  }
  precallC(L,_status,(uint)ci,(_status->val).value_.f);
  return (CallInfo *)0x0;
}

Assistant:

CallInfo *luaD_precall (lua_State *L, StkId func, int nresults) {
  unsigned status = cast_uint(nresults + 1);
  lua_assert(status <= MAXRESULTS + 1);
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      precallC(L, func, status, clCvalue(s2v(func))->f);
      return NULL;
    case LUA_VLCF:  /* light C function */
      precallC(L, func, status, fvalue(s2v(func)));
      return NULL;
    case LUA_VLCL: {  /* Lua function */
      CallInfo *ci;
      Proto *p = clLvalue(s2v(func))->p;
      int narg = cast_int(L->top.p - func) - 1;  /* number of real arguments */
      int nfixparams = p->numparams;
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      L->ci = ci = prepCallInfo(L, func, status, func + 1 + fsize);
      ci->u.l.savedpc = p->code;  /* starting point */
      for (; narg < nfixparams; narg++)
        setnilvalue(s2v(L->top.p++));  /* complete missing arguments */
      lua_assert(ci->top.p <= L->stack_last.p);
      return ci;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* space for metamethod */
      status = tryfuncTM(L, func, status);  /* try '__call' metamethod */
      goto retry;  /* try again with metamethod */
    }
  }
}